

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face_from_indices.h
# Opt level: O0

Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
* __thiscall
Gudhi::coxeter_triangulation::
face_from_indices<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           *__return_storage_ptr__,coxeter_triangulation *this,
          Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *simplex,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  bool bVar1;
  Vertex *pVVar2;
  OrderedSetPartition *pOVar3;
  Vertex *this_00;
  size_type __new_size;
  size_type __n;
  OrderedSetPartition *pOVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  reference puVar8;
  reference pvVar9;
  reference pvVar10;
  reference this_01;
  iterator __first;
  iterator __last;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *part;
  iterator __end0_3;
  iterator __begin0_3;
  OrderedSetPartition *__range2;
  size_t l_1;
  part_index j_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  value_type *__range3_1;
  unsigned_long uStack_a8;
  range_index i_2;
  part_index j_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  value_type *__range3;
  unsigned_long uStack_80;
  range_index i_1;
  part_index j;
  const_iterator __end0;
  const_iterator __begin0;
  value_type *__range4;
  ulong uStack_58;
  range_index i;
  size_t h;
  size_t l;
  size_t k;
  size_t d;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_local;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *simplex_local;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *value;
  
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Permutahedral_representation(__return_storage_ptr__);
  pVVar2 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::vertex((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)this);
  pOVar3 = (OrderedSetPartition *)std::vector<int,_std::allocator<int>_>::size(pVVar2);
  pVVar2 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::vertex((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)this);
  this_00 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::vertex(__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::operator=(this_00,pVVar2);
  __new_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)simplex);
  __n = __new_size - 1;
  pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::partition(__return_storage_ptr__);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(pOVar4,__new_size);
  pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)this);
  sVar5 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size(pOVar4);
  for (uStack_58 = 1; uStack_58 < __new_size; uStack_58 = uStack_58 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)simplex,uStack_58 - 1
                       );
    for (__range4._4_4_ = *pvVar6;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)simplex,uStack_58
                           ), __range4._4_4_ < *pvVar6; __range4._4_4_ = __range4._4_4_ + 1) {
      pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)this);
      pvVar7 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](pOVar4,(ulong)__range4._4_4_);
      __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar7);
      j = (part_index)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar7);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&j), bVar1) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end0);
        uStack_80 = *puVar8;
        pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::partition(__return_storage_ptr__);
        pvVar9 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pOVar4,uStack_58 - 1);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (pvVar9,&stack0xffffffffffffff80);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end0);
      }
    }
  }
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)simplex,__n);
  for (__range3._4_4_ = *pvVar6; __range3._4_4_ < sVar5; __range3._4_4_ = __range3._4_4_ + 1) {
    pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)this);
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](pOVar4,(ulong)__range3._4_4_);
    __end0_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar7);
    j_1 = (part_index)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar7);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&j_1), bVar1) {
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end0_1);
      uStack_a8 = *puVar8;
      pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(__return_storage_ptr__);
      pvVar9 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](pOVar4,__n);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (pvVar9,&stack0xffffffffffffff58);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0_1);
    }
  }
  for (__range3_1._4_4_ = 0;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)simplex,0),
      __range3_1._4_4_ < *pvVar6; __range3_1._4_4_ = __range3_1._4_4_ + 1) {
    pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)this);
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](pOVar4,(ulong)__range3_1._4_4_);
    __end0_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar7);
    j_2 = (part_index)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar7);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_2,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&j_2), bVar1) {
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end0_2);
      l_1 = *puVar8;
      if ((OrderedSetPartition *)l_1 == pOVar3) {
        for (__range2 = (OrderedSetPartition *)0x0; __range2 < pOVar3;
            __range2 = (OrderedSetPartition *)
                       ((long)&(__range2->
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1)) {
          pVVar2 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::vertex(__return_storage_ptr__);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pVVar2,(size_type)__range2);
          *pvVar10 = *pvVar10 + -1;
        }
      }
      else {
        pVVar2 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::vertex(__return_storage_ptr__);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pVVar2,l_1);
        *pvVar10 = *pvVar10 + 1;
      }
      pOVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(__return_storage_ptr__);
      pvVar9 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](pOVar4,__n);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar9,&l_1);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0_2);
    }
  }
  pOVar3 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::partition(__return_storage_ptr__);
  __end0_3 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::begin(pOVar3);
  part = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::
         vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ::end(pOVar3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_3,
                            (__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             *)&part), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator*(&__end0_3);
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_01);
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_01);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last._M_current);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator++(&__end0_3);
  }
  return __return_storage_ptr__;
}

Assistant:

Permutahedral_representation face_from_indices(const Permutahedral_representation& simplex,
                                               const Index_range& indices) {
  using range_index = typename Index_range::value_type;
  using Ordered_set_partition = typename Permutahedral_representation::OrderedSetPartition;
  using Part = typename Ordered_set_partition::value_type;
  using part_index = typename Part::value_type;
  Permutahedral_representation value;
  std::size_t d = simplex.vertex().size();
  value.vertex() = simplex.vertex();
  std::size_t k = indices.size() - 1;
  value.partition().resize(k + 1);
  std::size_t l = simplex.partition().size() - 1;
  for (std::size_t h = 1; h < k + 1; h++)
    for (range_index i = indices[h - 1]; i < indices[h]; i++)
      for (part_index j : simplex.partition()[i]) value.partition()[h - 1].push_back(j);
  for (range_index i = indices[k]; i < l + 1; i++)
    for (part_index j : simplex.partition()[i]) value.partition()[k].push_back(j);
  for (range_index i = 0; i < indices[0]; i++)
    for (part_index j : simplex.partition()[i]) {
      if (j != d)
        value.vertex()[j]++;
      else
        for (std::size_t l = 0; l < d; l++) value.vertex()[l]--;
      value.partition()[k].push_back(j);
    }
  // sort the values in each part (probably not needed)
  for (auto& part : value.partition()) std::sort(part.begin(), part.end());
  return value;
}